

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O0

void __thiscall
duckdb::ParquetColumnSchema::ParquetColumnSchema
          (ParquetColumnSchema *this,ParquetColumnSchema *parent,LogicalType *result_type,
          ParquetColumnSchemaType schema_type)

{
  undefined4 in_ECX;
  LogicalType *in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  value_type *in_stack_ffffffffffffff98;
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *this_00;
  
  *in_RDI = in_ECX;
  std::__cxx11::string::string((string *)(in_RDI + 2),(string *)(in_RSI + 8));
  duckdb::LogicalType::LogicalType((LogicalType *)(in_RDI + 10),in_RDX);
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RSI + 0x40);
  *(undefined8 *)(in_RDI + 0x12) = *(undefined8 *)(in_RSI + 0x48);
  *(undefined8 *)(in_RDI + 0x14) = *(undefined8 *)(in_RSI + 0x50);
  *(undefined8 *)(in_RDI + 0x16) = *(undefined8 *)(in_RSI + 0x58);
  optional_idx::optional_idx((optional_idx *)(in_RDI + 0x18));
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 1;
  in_RDI[0x1d] = 0;
  this_00 = (vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *)
            (in_RDI + 0x1e);
  vector<duckdb::ParquetColumnSchema,_true>::vector
            ((vector<duckdb::ParquetColumnSchema,_true> *)0x699d1f);
  std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::push_back
            (this_00,in_stack_ffffffffffffff98);
  return;
}

Assistant:

ParquetColumnSchema::ParquetColumnSchema(ParquetColumnSchema parent, LogicalType result_type,
                                         ParquetColumnSchemaType schema_type)
    : schema_type(schema_type), name(parent.name), type(std::move(result_type)), max_define(parent.max_define),
      max_repeat(parent.max_repeat), schema_index(parent.schema_index), column_index(parent.column_index) {
	children.push_back(std::move(parent));
}